

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O0

bool __thiscall
lemon::
BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::processNextRound(BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                   *this)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  size_type sVar5;
  Reference pvVar6;
  reference pvVar7;
  Key *key;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
  *this_00;
  long in_RDI;
  Reference RVar8;
  Value relaxed;
  Node target;
  OutArcIt it;
  int i_2;
  int i_1;
  vector<double,_std::allocator<double>_> values;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> nextProcess;
  int i;
  ReverseDigraphBase<const_lemon::SmartDigraph> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  _Bit_type in_stack_fffffffffffffee8;
  allocator_type *in_stack_fffffffffffffef0;
  vector<double,_std::allocator<double>_> *this_01;
  Key *in_stack_fffffffffffffef8;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
  *in_stack_ffffffffffffff00;
  Reference local_98;
  Value local_88;
  int local_7c;
  Arc local_74;
  Arc local_70 [5];
  int local_5c;
  int local_58;
  allocator<double> local_41;
  vector<double,_std::allocator<double>_> local_40 [2];
  undefined1 local_d;
  int local_c;
  
  for (local_c = 0; iVar2 = local_c,
      sVar5 = std::
              vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              ::size((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                      *)(in_RDI + 0x38)), iVar2 < (int)sVar5; local_c = local_c + 1) {
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                *)(in_RDI + 0x38),(long)local_c);
    local_d = 0;
    VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
    ::set(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
          (Value_conflict *)in_stack_fffffffffffffef0);
  }
  std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::vector
            ((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              *)0x2cdc90);
  std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::size
            ((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              *)(in_RDI + 0x38));
  std::allocator<double>::allocator((allocator<double> *)0x2cdcb8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             (size_type)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::allocator<double>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    iVar2 = local_58;
    sVar5 = std::
            vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
            size((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                  *)(in_RDI + 0x38));
    RVar8._M_mask = in_stack_fffffffffffffee8;
    RVar8._M_p = (_Bit_type *)in_stack_fffffffffffffef0;
    if ((int)sVar5 <= iVar2) break;
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                *)(in_RDI + 0x38),(long)local_58);
    pvVar6 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
             ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
                           *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          (Key *)in_stack_fffffffffffffed8);
    vVar1 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_58);
    *pvVar7 = vVar1;
    local_58 = local_58 + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = local_5c;
    sVar5 = std::
            vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
            size((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                  *)(in_RDI + 0x38));
    this_01 = (vector<double,_std::allocator<double>_> *)RVar8._M_p;
    if ((int)sVar5 <= iVar2) break;
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                *)(in_RDI + 0x38),(long)local_5c);
    DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>::OutArcIt::
    OutArcIt((OutArcIt *)RVar8._M_p,(Adaptor *)RVar8._M_mask,
             (Node *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    while( true ) {
      SmartDigraphBase::Arc::Arc(&local_74);
      bVar3 = SmartDigraphBase::Arc::operator!=(local_70,local_74);
      if (!bVar3) break;
      local_7c = (int)ReverseDigraphBase<const_lemon::SmartDigraph>::target
                                (in_stack_fffffffffffffed8,(Arc *)0x2cde5c);
      key = (Key *)std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_5c)
      ;
      this_00 = (VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                 *)VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                   ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                                 *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                (Key *)in_stack_fffffffffffffed8);
      local_88 = BellmanFordDefaultOperationTraits<double,_true>::plus
                           ((Value *)key,(Value *)this_00);
      pvVar6 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
               ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
                             *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                            (Key *)in_stack_fffffffffffffed8);
      bVar3 = BellmanFordDefaultOperationTraits<double,_true>::less(&local_88,pvVar6);
      if (bVar3) {
        ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        ::set((ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
               *)RVar8._M_p,(Key *)RVar8._M_mask,
              (Value *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
        ::set((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
               *)RVar8._M_p,(Key *)RVar8._M_mask,
              (Value *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        RVar8 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                              *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                             (Key *)in_stack_fffffffffffffed8);
        local_98 = RVar8;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_98);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
          ::set(this_00,key,(Value_conflict *)RVar8._M_p);
          std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
          ::push_back((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                       *)RVar8._M_p,(value_type *)RVar8._M_mask);
        }
      }
      DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>::OutArcIt::
      operator++((OutArcIt *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    local_5c = local_5c + 1;
  }
  std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::swap
            ((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              *)this_01,
             (vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              *)RVar8._M_mask);
  bVar4 = std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
          ::empty((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                   *)this_01);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
  ~vector((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> *)
          this_01);
  return (bool)(bVar4 & 1);
}

Assistant:

bool processNextRound() {
    for (int i = 0; i < int(_process.size()); ++i) {
      _mask->set(_process[i], false);
    }
    std::vector<Node>  nextProcess;
    std::vector<Value> values(_process.size());
    for (int i = 0; i < int(_process.size()); ++i) {
      values[i] = (*_dist)[_process[i]];
    }
    for (int i = 0; i < int(_process.size()); ++i) {
      for (OutArcIt it(*_gr, _process[i]); it != INVALID; ++it) {
        Node  target  = _gr->target(it);
        Value relaxed = OperationTraits::plus(values[i], (*_length)[it]);
        if (OperationTraits::less(relaxed, (*_dist)[target])) {
          _pred->set(target, it);
          _dist->set(target, relaxed);
          if (!(*_mask)[target]) {
            _mask->set(target, true);
            nextProcess.push_back(target);
          }
        }
      }
    }
    _process.swap(nextProcess);
    return _process.empty();
  }